

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iec61131.l.cpp
# Opt level: O2

yy_state_type __thiscall
deci_FlexLexer::yy_try_NUL_trans(deci_FlexLexer *this,yy_state_type yy_current_state)

{
  short sVar1;
  
  if (yy_accept[yy_current_state] != 0) {
    this->yy_last_accepting_state = yy_current_state;
    this->yy_last_accepting_cpos = this->yy_c_buf_p;
  }
  while( true ) {
    if (yy_current_state == yy_chk[(long)yy_base[yy_current_state] + 1]) break;
    yy_current_state = (yy_state_type)yy_def[yy_current_state];
  }
  sVar1 = 0;
  if (yy_nxt[(long)yy_base[yy_current_state] + 1] != 0x7a) {
    sVar1 = yy_nxt[(long)yy_base[yy_current_state] + 1];
  }
  return (int)sVar1;
}

Assistant:

yy_state_type yyFlexLexer::yy_try_NUL_trans( yy_state_type yy_current_state )
{
	int yy_is_jam;
    	char *yy_cp = (yy_c_buf_p);

	YY_CHAR yy_c = 1;
	if ( yy_accept[yy_current_state] )
		{
		(yy_last_accepting_state) = yy_current_state;
		(yy_last_accepting_cpos) = yy_cp;
		}
	while ( yy_chk[yy_base[yy_current_state] + yy_c] != yy_current_state )
		{
		yy_current_state = (int) yy_def[yy_current_state];
		if ( yy_current_state >= 123 )
			yy_c = yy_meta[yy_c];
		}
	yy_current_state = yy_nxt[yy_base[yy_current_state] + yy_c];
	yy_is_jam = (yy_current_state == 122);

		return yy_is_jam ? 0 : yy_current_state;
}